

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prop2octave.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  _Ios_Iostate __a;
  long lVar3;
  exception *ex;
  ofstream out;
  Properties prop;
  string p;
  string outname;
  string inname;
  Parameter param;
  char *def [6];
  char *in_stack_fffffffffffffbf8;
  Parameter *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  _Ios_Iostate _Var4;
  Properties *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  string local_3a0 [32];
  char *in_stack_fffffffffffffc80;
  ostream *in_stack_fffffffffffffc88;
  Properties *in_stack_fffffffffffffc90;
  string *in_stack_fffffffffffffcb8;
  Parameter *in_stack_fffffffffffffcc0;
  size_t in_stack_fffffffffffffd10;
  ostream *in_stack_fffffffffffffd18;
  Parameter *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  Parameter *in_stack_fffffffffffffd90;
  string local_148 [32];
  string local_128 [32];
  string local_108 [104];
  char *in_stack_ffffffffffffff60;
  char **in_stack_ffffffffffffff68;
  char **in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  Parameter *in_stack_ffffffffffffff80;
  int local_4;
  
  gutil::Parameter::Parameter
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::__cxx11::string::string(local_108);
  std::__cxx11::string::string(local_128);
  do {
    local_4 = 0;
    bVar1 = gutil::Parameter::isNextParameter
                      ((Parameter *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
    if (!bVar1) {
      iVar2 = gutil::Parameter::remaining(in_stack_fffffffffffffc00);
      if (iVar2 < 1) {
        gutil::Parameter::printHelp
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
        local_4 = 10;
      }
      else {
        gutil::Parameter::nextString
                  (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        iVar2 = gutil::Parameter::remaining(in_stack_fffffffffffffc00);
        if (0 < iVar2) {
          gutil::Parameter::nextString
                    (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        }
        std::__cxx11::string::c_str();
        gutil::Properties::Properties
                  (in_stack_fffffffffffffc10,
                   (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        lVar3 = std::__cxx11::string::size();
        if (lVar3 == 0) {
          std::operator+(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
          std::__cxx11::string::c_str();
          gutil::Properties::saveOctave
                    (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffc40);
        }
        else {
          std::ofstream::ofstream(&stack0xfffffffffffffc80);
          _Var4 = (int)&stack0xfffffffffffffc80 +
                  (int)*(undefined8 *)(in_stack_fffffffffffffc80 + -0x18);
          __a = std::operator|(_S_failbit,_S_badbit);
          std::operator|(__a,_S_eofbit);
          std::ios::exceptions(_Var4);
          std::ofstream::open((string *)&stack0xfffffffffffffc80,(_Ios_Openmode)local_128);
          std::operator+(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
          std::__cxx11::string::c_str();
          gutil::Properties::saveOctave
                    (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
          std::__cxx11::string::~string(local_3a0);
          std::ofstream::close();
          std::ofstream::~ofstream(&stack0xfffffffffffffc80);
        }
        gutil::Properties::~Properties((Properties *)0x115cb2);
      }
      break;
    }
    std::__cxx11::string::string(local_148);
    gutil::Parameter::nextParameter(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    in_stack_fffffffffffffc24 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc24);
    if (bVar1) {
      gutil::Parameter::printHelp
                (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    }
    local_4 = 0;
    std::__cxx11::string::~string(local_148);
  } while (!bVar1);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_108);
  gutil::Parameter::~Parameter(in_stack_fffffffffffffc00);
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
  try
  {
    const char *def[]=
    {
      "# prop2octave <property-file> [<output-file>]",
      "#",
      "# Converts a property file (i.e. key=value) into octave text format.",
      "#",
      "-help # Print help and exit.",
      0
    };

    gutil::Parameter param(argc, argv, def);

    // handle options

    std::string inname;
    std::string outname;

    while (param.isNextParameter())
    {
      std::string p;

      param.nextParameter(p);

      if (p == "-help")
      {
        param.printHelp(std::cout);
        return 0;
      }
    }

    if (param.remaining() < 1)
    {
      param.printHelp(std::cout);
      return 10;
    }

    param.nextString(inname);

    if (param.remaining() > 0)
    {
      param.nextString(outname);
    }

    // load properties file

    gutil::Properties prop(inname.c_str());

    if (outname.size() > 0)
    {
      std::ofstream out;

      out.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
      out.open(outname);

      prop.saveOctave(out, ("Converted from "+inname).c_str());

      out.close();
    }
    else
    {
      prop.saveOctave(std::cout, ("Converted from "+inname).c_str());
    }
  }
  catch (const std::exception &ex)
  {
    std::cerr << ex.what() << std::endl;
  }
}